

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O3

void __thiscall TestServerConnector::SendRawRequest(TestServerConnector *this,string *request)

{
  long *local_30 [2];
  long local_20 [2];
  
  (*this->handler->_vptr_JsonRpcServer[2])((string *)local_30,this->handler,request);
  std::__cxx11::string::operator=((string *)&this->raw_response,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void SendRawRequest(const string &request) { this->raw_response = handler.HandleRequest(request); }